

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5DecodeLocaleValue
              (sqlite3_value *pVal,char **ppText,int *pnText,char **ppLoc,int *pnLoc)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  long lVar4;
  
  pvVar2 = sqlite3_value_blob(pVal);
  iVar1 = sqlite3_value_bytes(pVal);
  pcVar3 = (char *)((long)pvVar2 + 0x11);
  lVar4 = 0;
  while( true ) {
    if (pcVar3[-1] == '\0') {
      *ppLoc = (char *)((long)pvVar2 + 0x10);
      *pnLoc = (int)lVar4;
      *ppText = pcVar3;
      *pnText = (iVar1 - (int)lVar4) + -0x11;
      return 0;
    }
    if ((ulong)(iVar1 - 1) - 0x10 == lVar4) break;
    pcVar3 = pcVar3 + 1;
    lVar4 = lVar4 + 1;
  }
  return 0x14;
}

Assistant:

static int sqlite3Fts5DecodeLocaleValue(
  sqlite3_value *pVal,
  const char **ppText,
  int *pnText,
  const char **ppLoc,
  int *pnLoc
){
  const char *p = sqlite3_value_blob(pVal);
  int n = sqlite3_value_bytes(pVal);
  int nLoc = 0;

  assert( sqlite3_value_type(pVal)==SQLITE_BLOB );
  assert( n>FTS5_LOCALE_HDR_SIZE );

  for(nLoc=FTS5_LOCALE_HDR_SIZE; p[nLoc]; nLoc++){
    if( nLoc==(n-1) ){
      return SQLITE_MISMATCH;
    }
  }
  *ppLoc = &p[FTS5_LOCALE_HDR_SIZE];
  *pnLoc = nLoc - FTS5_LOCALE_HDR_SIZE;

  *ppText = &p[nLoc+1];
  *pnText = n - nLoc - 1;
  return SQLITE_OK;
}